

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prng.c
# Opt level: O0

void prngCOMBOStart(void *state,u32 seed)

{
  prng_combo_st *s;
  u32 seed_local;
  void *state_local;
  
  *(undefined4 *)state = 0xf8b7bb93;
  *(undefined4 *)((long)state + 4) = 0xbee3b54b;
  *(u32 *)((long)state + 8) = seed + 0x1f6b7fbd;
  if (*(int *)((long)state + 8) != 0) {
    *(int *)((long)state + 8) = *(int *)((long)state + 8) + 1;
  }
  *(undefined8 *)((long)state + 0x10) = 0;
  return;
}

Assistant:

void prngCOMBOStart(void* state, u32 seed)
{
	prng_combo_st* s = (prng_combo_st*)state;
	ASSERT(memIsValid(s, sizeof(*s)));
	s->x = 0xF8B7BB93;
	s->y = 0xBEE3B54B;
	s->z = 0x1F6B7FBD + seed;
	if (s->z)
		++s->z;
	s->reserved = 0;
}